

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O3

DdNode * addTriangleRecur(DdManager *dd,DdNode *f,DdNode *g,int *vars,DdNode *cube)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  int iVar8;
  DdNode *g_00;
  ulong uVar9;
  
  pDVar4 = dd->plusinfinity;
  if (pDVar4 == g || pDVar4 == f) {
    return pDVar4;
  }
  if ((f->index == 0x7fffffff) && (g->index == 0x7fffffff)) {
    pDVar4 = cuddUniqueConst(dd,(f->type).value + (g->type).value);
    return pDVar4;
  }
  pDVar4 = f;
  if (f < g) {
    pDVar4 = g;
    g = f;
  }
  if (((pDVar4->ref != 1) || (g->ref != 1)) &&
     (pDVar5 = cuddCacheLookup(dd,0x86,pDVar4,g,cube), pDVar5 != (DdNode *)0x0)) {
    return pDVar5;
  }
  iVar3 = 0x7fffffff;
  iVar8 = 0x7fffffff;
  if ((ulong)pDVar4->index != 0x7fffffff) {
    iVar8 = dd->perm[pDVar4->index];
  }
  if ((ulong)g->index != 0x7fffffff) {
    iVar3 = dd->perm[g->index];
  }
  pDVar5 = pDVar4;
  pDVar6 = pDVar4;
  iVar2 = iVar3;
  if (iVar8 <= iVar3) {
    pDVar5 = (pDVar4->type).kids.T;
    pDVar6 = (pDVar4->type).kids.E;
    iVar2 = iVar8;
  }
  pDVar7 = g;
  g_00 = g;
  if (iVar3 <= iVar8) {
    pDVar7 = (g->type).kids.T;
    g_00 = (g->type).kids.E;
  }
  pDVar5 = addTriangleRecur(dd,pDVar5,pDVar7,vars,cube);
  if (pDVar5 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar6 = addTriangleRecur(dd,pDVar6,g_00,vars,cube);
    if (pDVar6 != (DdNode *)0x0) {
      uVar9 = (ulong)pDVar6 & 0xfffffffffffffffe;
      *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + 1;
      if (vars[dd->invperm[iVar2]] < 0) {
        pDVar7 = pDVar5;
        if ((pDVar5 == pDVar6) ||
           (pDVar7 = cuddUniqueInter(dd,dd->invperm[iVar2],pDVar5,pDVar6), pDVar7 != (DdNode *)0x0))
        {
          piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          goto LAB_0078ea5a;
        }
        Cudd_RecursiveDeref(dd,pDVar5);
        pDVar5 = pDVar6;
      }
      else {
        pDVar7 = cuddAddApplyRecur(dd,Cudd_addMinimum,pDVar5,pDVar6);
        if (pDVar7 != (DdNode *)0x0) {
          uVar9 = (ulong)pDVar7 & 0xfffffffffffffffe;
          *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + 1;
          Cudd_RecursiveDeref(dd,pDVar5);
          Cudd_RecursiveDeref(dd,pDVar6);
LAB_0078ea5a:
          *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + -1;
          if ((pDVar4->ref == 1) && (g->ref == 1)) {
            return pDVar7;
          }
          cuddCacheInsert(dd,0x86,pDVar4,g,cube,pDVar7);
          return pDVar7;
        }
        Cudd_RecursiveDeref(dd,pDVar5);
        pDVar5 = pDVar6;
      }
    }
    Cudd_RecursiveDeref(dd,pDVar5);
  }
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
addTriangleRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  int * vars,
  DdNode *cube)
{
    DdNode *fv, *fvn, *gv, *gvn, *t, *e, *res;
    CUDD_VALUE_TYPE value;
    int top, topf, topg, index;

    statLine(dd);
    if (f == DD_PLUS_INFINITY(dd) || g == DD_PLUS_INFINITY(dd)) {
        return(DD_PLUS_INFINITY(dd));
    }

    if (cuddIsConstant(f) && cuddIsConstant(g)) {
        value = cuddV(f) + cuddV(g);
        res = cuddUniqueConst(dd, value);
        return(res);
    }
    if (f < g) {
        DdNode *tmp = f;
        f = g;
        g = tmp;
    }

    if (f->ref != 1 || g->ref != 1) {
        res = cuddCacheLookup(dd, DD_ADD_TRIANGLE_TAG, f, g, cube);
        if (res != NULL) {
            return(res);
        }
    }

    topf = cuddI(dd,f->index); topg = cuddI(dd,g->index);
    top = ddMin(topf,topg);

    if (top == topf) {fv = cuddT(f); fvn = cuddE(f);} else {fv = fvn = f;}
    if (top == topg) {gv = cuddT(g); gvn = cuddE(g);} else {gv = gvn = g;}

    t = addTriangleRecur(dd, fv, gv, vars, cube);
    if (t == NULL) return(NULL);
    cuddRef(t);
    e = addTriangleRecur(dd, fvn, gvn, vars, cube);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd, t);
        return(NULL);
    }
    cuddRef(e);

    index = dd->invperm[top];
    if (vars[index] < 0) {
        res = (t == e) ? t : cuddUniqueInter(dd,index,t,e);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, t);
            Cudd_RecursiveDeref(dd, e);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    } else {
        res = cuddAddApplyRecur(dd,Cudd_addMinimum,t,e);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, t);
            Cudd_RecursiveDeref(dd, e);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDeref(dd, t);
        Cudd_RecursiveDeref(dd, e);
        cuddDeref(res);
    }

    if (f->ref != 1 || g->ref != 1) {
        cuddCacheInsert(dd, DD_ADD_TRIANGLE_TAG, f, g, cube, res);
    }

    return(res);

}